

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O0

StatelessGenerator<std::vector<int,_std::allocator<int>_>_>
cppqc::listOf<int>(StatelessGenerator<int> *g)

{
  __uniq_ptr_impl<cppqc::detail::StatelessGenConcept<std::vector<int,_std::allocator<int>_>_>,_std::default_delete<cppqc::detail::StatelessGenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
  in_RDI;
  StatelessGenerator<int> *in_stack_ffffffffffffffb8;
  ListOfStatelessGenerator<int> *in_stack_ffffffffffffffd8;
  StatelessGenerator<std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffffe0;
  
  detail::ListOfStatelessGenerator<int>::ListOfStatelessGenerator
            ((ListOfStatelessGenerator<int> *)
             in_RDI._M_t.
             super__Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<std::vector<int,_std::allocator<int>_>_>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
             .
             super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<std::vector<int,_std::allocator<int>_>_>_*,_false>
             ._M_head_impl,in_stack_ffffffffffffffb8);
  StatelessGenerator<std::vector<int,std::allocator<int>>>::
  StatelessGenerator<cppqc::detail::ListOfStatelessGenerator<int>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  detail::ListOfStatelessGenerator<int>::~ListOfStatelessGenerator
            ((ListOfStatelessGenerator<int> *)0x11dc5a);
  return (unique_ptr<cppqc::detail::StatelessGenConcept<std::vector<int,_std::allocator<int>_>_>,_std::default_delete<cppqc::detail::StatelessGenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
          )(unique_ptr<cppqc::detail::StatelessGenConcept<std::vector<int,_std::allocator<int>_>_>,_std::default_delete<cppqc::detail::StatelessGenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
            )in_RDI._M_t.
             super__Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<std::vector<int,_std::allocator<int>_>_>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
             .
             super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<std::vector<int,_std::allocator<int>_>_>_*,_false>
             ._M_head_impl;
}

Assistant:

StatelessGenerator<std::vector<T>> listOf(
    const StatelessGenerator<T>& g = Arbitrary<T>()) {
  return detail::ListOfStatelessGenerator<T>(g);
}